

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

int __thiscall TPZIntTriang::NPoints(TPZIntTriang *this)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = TPZIntRuleT::NInt(*(TPZIntRuleT **)(in_RDI + 0x10));
  return iVar1;
}

Assistant:

int TPZIntTriang::NPoints() const {
#ifdef PZDEBUG
	if (!fIntKsi){
		PZError << "Null Pointer passed to method TPZIntTriang::NPoints()\n";
        DebugStop();
		return 0;
	}
#endif
	return fIntKsi->NInt();
}